

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

int raviX_bitset_intersect_p(BitSet *bm1,BitSet *bm2)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = bm2->els_num;
  if (bm1->els_num < bm2->els_num) {
    uVar3 = bm1->els_num;
  }
  uVar4 = 0;
  do {
    if (uVar3 == uVar4) {
      return 0;
    }
    puVar1 = bm2->varr + uVar4;
    puVar2 = bm1->varr + uVar4;
    uVar4 = uVar4 + 1;
  } while ((*puVar2 & *puVar1) == 0);
  return 1;
}

Assistant:

int raviX_bitset_intersect_p(const BitSet * bm1, const BitSet * bm2) {
	size_t i, min_len, bm1_len = bm1->els_num;
	size_t bm2_len = bm2->els_num;
	bitset_el_t *addr1 = bm1->varr;
	bitset_el_t *addr2 = bm2->varr;

	min_len = bm1_len <= bm2_len ? bm1_len : bm2_len;
	for (i = 0; i < min_len; i++)
		if ((addr1[i] & addr2[i]) != 0) return true;
	return false;
}